

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * duckdb_moodycamel::
        ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
        ::
        create<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (void)

{
  Block *pBVar1;
  size_t unaff_retaddr;
  void *p;
  Block *in_stack_fffffffffffffff0;
  
  pBVar1 = (Block *)aligned_malloc<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                              (unaff_retaddr);
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = (Block *)0x0;
  }
  else {
    ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
    Block::Block(in_stack_fffffffffffffff0);
  }
  return pBVar1;
}

Assistant:

static inline U* create()
	{
		void* p = aligned_malloc<U>(sizeof(U));
		return p != nullptr ? new (p) U : nullptr;
	}